

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_6d7a8::ParserImpl::ParseTableConstructor(ParserImpl *this)

{
  TokenDetail op;
  TokenDetail op_00;
  TokenDetail op_01;
  TokenDetail op_02;
  vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
  *this_00;
  int iVar1;
  TokenDetail *pTVar2;
  anon_union_8_2_010d16d7_for_TokenDetail_0 *paVar3;
  TokenDetail *pTVar4;
  ParseException *pPVar5;
  ParserImpl *in_RSI;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar6;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> index;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value;
  TokenDetail name;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value_2;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_c8;
  undefined1 local_c0 [16];
  String *local_b0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_a8;
  long *local_a0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_98;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_90;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_88;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_80;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_78;
  String *pSStack_70;
  undefined8 local_68;
  int iStack_60;
  undefined4 uStack_5c;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_50;
  ParserImpl *local_48;
  _func_int **local_40;
  _func_int **local_38;
  
  local_48 = this;
  NextToken(in_RSI);
  if ((in_RSI->current_).token_ != 0x7b) {
    __assert_fail("current_.token_ == \'{\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x2f6,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableConstructor()"
                 );
  }
  local_b0 = (String *)&in_RSI->current_;
  local_50._M_head_impl = (SyntaxTree *)operator_new(0x28);
  iVar1 = (in_RSI->current_).line_;
  (local_50._M_head_impl)->_vptr_SyntaxTree = (_func_int **)&PTR__TableDefine_00154418;
  this_00 = (vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
             *)(local_50._M_head_impl + 1);
  local_50._M_head_impl[1]._vptr_SyntaxTree = (_func_int **)0x0;
  local_50._M_head_impl[2]._vptr_SyntaxTree = (_func_int **)0x0;
  local_50._M_head_impl[3]._vptr_SyntaxTree = (_func_int **)0x0;
  *(int *)&local_50._M_head_impl[4]._vptr_SyntaxTree = iVar1;
  pTVar4 = &in_RSI->look_ahead_;
  local_40 = (_func_int **)&PTR__TableNameField_00154498;
  local_38 = (_func_int **)&PTR__TableIndexField_00154458;
  do {
    do {
      iVar1 = (in_RSI->look_ahead_).token_;
      if (iVar1 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar4);
        iVar1 = (in_RSI->look_ahead_).token_;
      }
      if (iVar1 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar4);
        iVar1 = (in_RSI->look_ahead_).token_;
      }
      else if (iVar1 == 0x7d) {
        pTVar4 = NextToken(in_RSI);
        if (pTVar4->token_ == 0x7d) {
          local_48->lexer_ = (Lexer *)local_50._M_head_impl;
          return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                  )(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                    )local_50._M_head_impl;
        }
        pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar5,"expect \'}\' for table",(TokenDetail *)local_b0);
        goto LAB_0012dfc9;
      }
      if (iVar1 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar4);
        iVar1 = (in_RSI->look_ahead_).token_;
LAB_0012ddc9:
        if (iVar1 == 0x115) {
          pTVar2 = LookAhead2(in_RSI);
          if (pTVar2->token_ == 0x3d) {
            paVar3 = &NextToken(in_RSI)->field_0;
            local_98 = *paVar3;
            aStack_90 = paVar3[1];
            local_88 = paVar3[2];
            aStack_80 = paVar3[3];
            NextToken(in_RSI);
            if ((in_RSI->current_).token_ != 0x3d) {
              __assert_fail("current_.token_ == \'=\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                            ,0x32a,
                            "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableNameField()"
                           );
            }
            local_c8.number_ = 0.0;
            local_78.number_ = 0.0;
            pSStack_70 = (String *)0x0;
            local_68._0_4_ = 0;
            local_68._4_4_ = 0;
            iStack_60 = 0x11e;
            op_01._28_4_ = uStack_5c;
            op_01.token_ = 0x11e;
            op_01.line_ = 0;
            op_01.column_ = 0;
            op_01.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
            op_01.module_ = (String *)0x0;
            ParseExp((ParserImpl *)local_c0,
                     (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                     op_01,(int)&local_c8);
            if (local_c8.str_ != (String *)0x0) {
              (*((local_c8.str_)->super_GCObject)._vptr_GCObject[1])();
            }
            local_c0._8_8_ = operator_new(0x30);
            (((String *)local_c0._8_8_)->super_GCObject)._vptr_GCObject = local_40;
            (((String *)local_c0._8_8_)->super_GCObject).next_ = (GCObject *)local_98;
            *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
             &(((String *)local_c0._8_8_)->super_GCObject).field_0x10 = aStack_90;
            (((String *)local_c0._8_8_)->field_1).str_ = (char *)local_88;
            *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
             ((long)&((String *)local_c0._8_8_)->field_1 + 8) = aStack_80;
            *(undefined8 *)&((String *)local_c0._8_8_)->length_ = local_c0._0_8_;
            std::
            vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
            ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                      (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                *)(local_c0 + 8));
            aVar6 = (anon_union_8_2_010d16d7_for_TokenDetail_0)local_c0._8_8_;
            goto LAB_0012df58;
          }
          iVar1 = (in_RSI->look_ahead_).token_;
        }
        if (iVar1 == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,pTVar4);
        }
        iVar1 = (in_RSI->look_ahead_).line_;
        local_c0._0_8_ = (Lexer *)0x0;
        local_98.number_ = 0.0;
        aStack_90.number_ = 0.0;
        local_88.number_ = 0.0;
        aStack_80._0_4_ = 0x11e;
        op_02.line_ = 0;
        op_02.column_ = 0;
        op_02.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_02.module_ = (String *)0x0;
        op_02._24_8_ = aStack_80.str_;
        ParseExp((ParserImpl *)&local_78,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_02,(int)local_c0);
        if ((Lexer *)local_c0._0_8_ != (Lexer *)0x0) {
          (*(code *)((*(State **)local_c0._0_8_)->string_pool_)._M_t.
                    super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>
                    .super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
        }
        local_c8.str_ = (String *)operator_new(0x18);
        ((local_c8.str_)->super_GCObject)._vptr_GCObject =
             (_func_int **)&PTR__TableArrayField_001544d8;
        ((local_c8.str_)->super_GCObject).next_ = (GCObject *)local_78;
        *(int *)&((local_c8.str_)->super_GCObject).field_0x10 = iVar1;
        std::
        vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
        ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                  (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                           &local_c8);
        aVar6 = local_c8;
      }
      else {
        if (iVar1 != 0x5b) goto LAB_0012ddc9;
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x5b) {
          __assert_fail("current_.token_ == \'[\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x313,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableIndexField()"
                       );
        }
        if ((in_RSI->look_ahead_).token_ == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,pTVar4);
        }
        iVar1 = (in_RSI->look_ahead_).line_;
        local_c8.number_ = 0.0;
        local_98.number_ = 0.0;
        aStack_90.number_ = 0.0;
        local_88.number_ = 0.0;
        aStack_80._0_4_ = 0x11e;
        op.line_ = 0;
        op.column_ = 0;
        op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op.module_ = (String *)0x0;
        op._24_8_ = aStack_80.str_;
        ParseExp((ParserImpl *)local_c0,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
                 (int)&local_c8);
        if (local_c8.str_ != (String *)0x0) {
          (*((local_c8.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        pTVar2 = NextToken(in_RSI);
        if (pTVar2->token_ != 0x5d) {
          pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar5,"expect \']\'",(TokenDetail *)local_b0);
LAB_0012e079:
          __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        pTVar2 = NextToken(in_RSI);
        if (pTVar2->token_ != 0x3d) {
          pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar5,"expect \'=\'",(TokenDetail *)local_b0);
          goto LAB_0012e079;
        }
        local_a0 = (long *)0x0;
        local_78.number_ = 0.0;
        pSStack_70 = (String *)0x0;
        local_68._0_4_ = 0;
        local_68._4_4_ = 0;
        iStack_60 = 0x11e;
        op_00._28_4_ = uStack_5c;
        op_00.token_ = 0x11e;
        op_00.line_ = 0;
        op_00.column_ = 0;
        op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_00.module_ = (String *)0x0;
        ParseExp((ParserImpl *)(local_c0 + 8),
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_00,(int)&local_a0);
        if (local_a0 != (long *)0x0) {
          (**(code **)(*local_a0 + 8))();
        }
        local_a8.str_ = (String *)operator_new(0x20);
        ((local_a8.str_)->super_GCObject)._vptr_GCObject = local_38;
        ((local_a8.str_)->super_GCObject).next_ = (GCObject *)local_c0._0_8_;
        *(undefined8 *)&((local_a8.str_)->super_GCObject).field_0x10 = local_c0._8_8_;
        *(int *)&(local_a8.str_)->field_1 = iVar1;
        std::
        vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
        ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                  (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                           &local_a8);
        aVar6 = local_a8;
      }
LAB_0012df58:
      if (aVar6.str_ != (String *)0x0) {
        (*((aVar6.str_)->super_GCObject)._vptr_GCObject[1])();
      }
      iVar1 = (in_RSI->look_ahead_).token_;
      if (iVar1 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar4);
        iVar1 = (in_RSI->look_ahead_).token_;
      }
    } while (iVar1 == 0x7d);
    NextToken(in_RSI);
    iVar1 = (in_RSI->current_).token_;
  } while ((iVar1 == 0x2c) || (iVar1 == 0x3b));
  pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
  luna::ParseException::ParseException
            (pPVar5,"expect \',\' or \';\' to split table fields",(TokenDetail *)local_b0);
LAB_0012dfc9:
  __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
}

Assistant:

std::unique_ptr<SyntaxTree> ParseTableConstructor()
        {
            NextToken();
            assert(current_.token_ == '{');

            std::unique_ptr<TableDefine> table(new TableDefine(current_.line_));

            while (LookAhead().token_ != '}')
            {
                if (LookAhead().token_ == '[')
                    table->fields_.push_back(ParseTableIndexField());
                else if (LookAhead().token_ == Token_Id && LookAhead2().token_ == '=')
                    table->fields_.push_back(ParseTableNameField());
                else
                    table->fields_.push_back(ParseTableArrayField());

                if (LookAhead().token_ != '}')
                {
                    NextToken();
                    if (current_.token_ != ',' && current_.token_ != ';')
                        throw ParseException("expect ',' or ';' to split table fields", current_);
                }
            }

            if (NextToken().token_ != '}')
                throw ParseException("expect '}' for table", current_);
            return std::move(table);
        }